

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::UnshuffleTests(UnitTestImpl *this)

{
  value_type vVar1;
  TestCase *pTVar2;
  reference pvVar3;
  long in_RDI;
  size_t i;
  TestCase *pTVar4;
  TestCase *this_00;
  
  pTVar4 = (TestCase *)0x0;
  while( true ) {
    this_00 = pTVar4;
    pTVar2 = (TestCase *)
             std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::size
                       ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)
                        (in_RDI + 0xb8));
    if (pTVar2 <= pTVar4) break;
    std::vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>::operator[]
              ((vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *)(in_RDI + 0xb8),
               (size_type)this_00);
    TestCase::UnshuffleTests(this_00);
    vVar1 = (value_type)this_00;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd0),(size_type)this_00);
    *pvVar3 = vVar1;
    pTVar4 = (TestCase *)((long)&this_00->_vptr_TestCase + 1);
  }
  return;
}

Assistant:

void UnitTestImpl::UnshuffleTests() {
  for (size_t i = 0; i < test_cases_.size(); i++) {
    // Unshuffles the tests in each test case.
    test_cases_[i]->UnshuffleTests();
    // Resets the index of each test case.
    test_case_indices_[i] = static_cast<int>(i);
  }
}